

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void * phmap::priv::Allocate<8ul,std::allocator<std::__cxx11::string>>
                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *alloc,size_t n)

{
  M *pMVar1;
  A mem_alloc;
  new_allocator<M> local_1;
  
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                  ,0x120f,
                  "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::basic_string<char>>]"
                 );
  }
  pMVar1 = __gnu_cxx::new_allocator<M>::allocate(&local_1,n + 7 >> 3,(void *)0x0);
  if (((ulong)pMVar1 & 7) == 0) {
    return pMVar1;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap_base.h"
                ,0x1216,
                "void *phmap::priv::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::basic_string<char>>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n)
		{
			static_assert(Alignment > 0, "");
			assert(n && "n must be positive");
			struct alignas(Alignment) M {};
			using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
			using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
			A mem_alloc(*alloc);
			void* p = AT::allocate(mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
			assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
			       "allocator does not respect alignment");
			return p;
		}